

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::SetImportDetailProperties
          (cmExportFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint __val;
  cmMakefile *this_00;
  pointer pbVar2;
  pointer pbVar3;
  char cVar4;
  bool bVar5;
  char cVar6;
  TargetType TVar7;
  ManagedType MVar8;
  mapped_type *pmVar9;
  cmLinkInterface *pcVar10;
  cmValue cVar11;
  uint uVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string prop;
  string value;
  key_type local_a0;
  string local_80;
  ImportPropertyMap *local_60;
  string local_58;
  string *local_38;
  
  this_00 = target->Makefile;
  local_60 = properties;
  TVar7 = cmGeneratorTarget::GetType(target);
  if (TVar7 != SHARED_LIBRARY) {
    TVar7 = cmGeneratorTarget::GetType(target);
    if (TVar7 != MODULE_LIBRARY) goto LAB_003978ce;
  }
  bVar5 = cmGeneratorTarget::IsDLLPlatform(target);
  if (!bVar5) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_allocated_capacity =
         local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    bVar5 = cmGeneratorTarget::HasSOName(target,config);
    if (bVar5) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
      bVar5 = cmMakefile::IsOn(this_00,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        (*this->_vptr_cmExportFileGenerator[0x14])(&local_80,this,target,config);
        std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_a0,0,(char *)local_a0._M_string_length,0x6e6a09);
      cmGeneratorTarget::GetSOName(&local_80,target,config);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&local_a0,0,(char *)local_a0._M_string_length,0x6e6a19);
      std::__cxx11::string::_M_replace
                ((ulong)&local_58,0,(char *)local_58._M_string_length,0x6ae1b3);
    }
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(suffix->_M_dataplus)._M_p);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_60,&local_a0);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
LAB_003978ce:
  local_38 = config;
  pcVar10 = cmGeneratorTarget::GetLinkInterface(target,config,target);
  if (pcVar10 != (cmLinkInterface *)0x0) {
    paVar1 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"IMPORTED_LINK_INTERFACE_LANGUAGES","");
    SetImportLinkProperty<std::__cxx11::string>
              (this,suffix,target,&local_a0,&pcVar10->Languages,local_60,No);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    pbVar2 = (this->MissingTargets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (this->MissingTargets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"IMPORTED_LINK_DEPENDENT_LIBRARIES","");
    SetImportLinkProperty<cmLinkItem>
              (this,suffix,target,&local_a0,&pcVar10->SharedDeps,local_60,Yes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->MissingTargets,(long)pbVar2 - (long)pbVar3 >> 5);
    if (pcVar10->Multiplicity != 0) {
      local_a0.field_2._8_8_ = (suffix->_M_dataplus)._M_p;
      local_a0.field_2._M_allocated_capacity = suffix->_M_string_length;
      local_a0._M_dataplus._M_p = (pointer)0x24;
      local_a0._M_string_length = 0x6e6a70;
      views._M_len = 2;
      views._M_array = (iterator)&local_a0;
      cmCatViews_abi_cxx11_(&local_58,views);
      __val = pcVar10->Multiplicity;
      cVar6 = '\x01';
      if (9 < __val) {
        uVar12 = __val;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          if (uVar12 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_00397a5b;
          }
          if (uVar12 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_00397a5b;
          }
          if (uVar12 < 10000) goto LAB_00397a5b;
          bVar5 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar4 = cVar6 + '\x04';
        } while (bVar5);
        cVar6 = cVar6 + '\x01';
      }
LAB_00397a5b:
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_a0,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,__val);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_60,&local_58);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  MVar8 = cmGeneratorTarget::GetManagedType(target,local_38);
  if (MVar8 != Native) {
    local_a0.field_2._8_8_ = (suffix->_M_dataplus)._M_p;
    local_a0.field_2._M_allocated_capacity = suffix->_M_string_length;
    local_a0._M_dataplus._M_p = (pointer)0x20;
    local_a0._M_string_length = 0x6e6a95;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_a0;
    cmCatViews_abi_cxx11_(&local_58,views_00);
    local_a0._M_string_length = 0;
    local_a0.field_2._M_allocated_capacity =
         local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"COMMON_LANGUAGE_RUNTIME","");
    cVar11 = cmGeneratorTarget::GetProperty(target,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (cVar11.Value == (string *)0x0) {
      bVar5 = cmGeneratorTarget::IsCSharpOnly(target);
      if (bVar5) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_a0,0,(char *)local_a0._M_string_length,0x6e6ab6);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_a0);
    }
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_60,&local_58);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportDetailProperties(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  // Add the soname for unix shared libraries.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY ||
      target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    if (!target->IsDLLPlatform()) {
      std::string prop;
      std::string value;
      if (target->HasSOName(config)) {
        if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
          value = this->InstallNameDir(target, config);
        }
        prop = "IMPORTED_SONAME";
        value += target->GetSOName(config);
      } else {
        prop = "IMPORTED_NO_SONAME";
        value = "TRUE";
      }
      prop += suffix;
      properties[prop] = value;
    }
  }

  // Add the transitive link dependencies for this configuration.
  if (cmLinkInterface const* iface =
        target->GetLinkInterface(config, target)) {
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_INTERFACE_LANGUAGES", iface->Languages,
      properties, ImportLinkPropertyTargetNames::No);

    // Export IMPORTED_LINK_DEPENDENT_LIBRARIES to help consuming linkers
    // find private dependencies of shared libraries.
    std::size_t oldMissingTargetsSize = this->MissingTargets.size();
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_DEPENDENT_LIBRARIES", iface->SharedDeps,
      properties, ImportLinkPropertyTargetNames::Yes);
    // Avoid enforcing shared library private dependencies as public package
    // dependencies by ignoring missing targets added for them.
    this->MissingTargets.resize(oldMissingTargetsSize);

    if (iface->Multiplicity > 0) {
      std::string prop =
        cmStrCat("IMPORTED_LINK_INTERFACE_MULTIPLICITY", suffix);
      properties[prop] = std::to_string(iface->Multiplicity);
    }
  }

  // Add information if this target is a managed target
  if (target->GetManagedType(config) !=
      cmGeneratorTarget::ManagedType::Native) {
    std::string prop = cmStrCat("IMPORTED_COMMON_LANGUAGE_RUNTIME", suffix);
    std::string propval;
    if (cmValue p = target->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
      propval = *p;
    } else if (target->IsCSharpOnly()) {
      // C# projects do not have the /clr flag, so we set the property
      // here to mark the target as (only) managed (i.e. no .lib file
      // to link to). Otherwise the  COMMON_LANGUAGE_RUNTIME target
      // property would have to be set manually for C# targets to make
      // exporting/importing work.
      propval = "CSharp";
    }
    properties[prop] = propval;
  }
}